

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

QObject * qt_qFindChild_helper
                    (QObject *parent,QAnyStringView name,QMetaObject *mo,FindChildOptions options)

{
  QObjectData *pQVar1;
  long lVar2;
  QObject **ppQVar3;
  bool bVar4;
  QObject *pQVar5;
  QObject *pQVar6;
  long lVar7;
  bool bVar8;
  QObject *local_58;
  
  pQVar1 = (parent->d_ptr).d;
  lVar2 = (pQVar1->children).d.size;
  bVar8 = lVar2 == 0;
  if (!bVar8) {
    ppQVar3 = (pQVar1->children).d.ptr;
    lVar7 = 0;
    do {
      pQVar6 = *(QObject **)((long)ppQVar3 + lVar7);
      pQVar5 = QMetaObject::cast(mo,pQVar6);
      if ((pQVar5 == (QObject *)0x0) ||
         ((name.field_0.m_data != (void *)0x0 &&
          (bVar4 = matches_objectName_non_null(pQVar6,name), !bVar4)))) {
        bVar4 = true;
      }
      else {
        bVar4 = false;
        local_58 = pQVar6;
      }
      if (!bVar4) break;
      lVar7 = lVar7 + 8;
      bVar8 = lVar2 << 3 == lVar7;
    } while (!bVar8);
  }
  if (bVar8) {
    if (((uint)options.super_QFlagsStorageHelper<Qt::FindChildOption,_4>.
               super_QFlagsStorage<Qt::FindChildOption>.i & 1) != 0) {
      pQVar1 = (parent->d_ptr).d;
      lVar2 = (pQVar1->children).d.size;
      bVar8 = lVar2 == 0;
      pQVar6 = local_58;
      if (!bVar8) {
        ppQVar3 = (pQVar1->children).d.ptr;
        pQVar6 = qt_qFindChild_helper(*ppQVar3,name,mo,options);
        if (pQVar6 == (QObject *)0x0) {
          lVar7 = 8;
          do {
            bVar8 = lVar2 << 3 == lVar7;
            pQVar6 = local_58;
            if (bVar8) break;
            pQVar6 = qt_qFindChild_helper(*(QObject **)((long)ppQVar3 + lVar7),name,mo,options);
            lVar7 = lVar7 + 8;
          } while (pQVar6 == (QObject *)0x0);
        }
      }
      if (!bVar8) {
        return pQVar6;
      }
    }
    local_58 = (QObject *)0x0;
  }
  return local_58;
}

Assistant:

QObject *qt_qFindChild_helper(const QObject *parent, QAnyStringView name, const QMetaObject &mo, Qt::FindChildOptions options)
{
    Q_ASSERT(parent);
    for (QObject *obj : parent->children()) {
        if (mo.cast(obj) && (name.isNull() || matches_objectName_non_null(obj, name)))
           return obj;
    }
    if (options & Qt::FindChildrenRecursively) {
        for (QObject *child : parent->children()) {
            if (QObject *obj = qt_qFindChild_helper(child, name, mo, options))
                return obj;
        }
    }
    return nullptr;
}